

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawShaderDrawParametersTests.cpp
# Opt level: O0

void __thiscall
vkt::Draw::(anonymous_namespace)::DrawTest::setIndirectCommand<vk::VkDrawIndexedIndirectCommand,3ul>
          (DrawTest *this,VkDrawIndexedIndirectCommand (*pCmdData) [3])

{
  DeviceInterface *vkd;
  Buffer *pBVar1;
  void *dst;
  VkDevice device;
  VkDeviceSize offset;
  Allocation local_98;
  Allocation local_78;
  VkDeviceMemory local_58;
  Allocation local_40;
  undefined8 local_20;
  size_t dataSize;
  VkDrawIndexedIndirectCommand (*pCmdData_local) [3];
  DrawTest *this_local;
  
  local_20 = 0x3c;
  dataSize = (size_t)pCmdData;
  pCmdData_local = (VkDrawIndexedIndirectCommand (*) [3])this;
  pBVar1 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                     ((SharedPtr<vkt::Draw::Buffer> *)(this + 0x1d0));
  Draw::Buffer::getBoundMemory(&local_40,pBVar1);
  dst = ::vk::Allocation::getHostPtr(&local_40);
  ::deMemcpy(dst,(void *)dataSize,0x3c);
  ::vk::Allocation::~Allocation(&local_40);
  vkd = *(DeviceInterface **)(this + 0x18);
  device = Context::getDevice(*(Context **)(this + 8));
  pBVar1 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                     ((SharedPtr<vkt::Draw::Buffer> *)(this + 0x1d0));
  Draw::Buffer::getBoundMemory(&local_78,pBVar1);
  local_58 = ::vk::Allocation::getMemory(&local_78);
  pBVar1 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                     ((SharedPtr<vkt::Draw::Buffer> *)(this + 0x1d0));
  Draw::Buffer::getBoundMemory(&local_98,pBVar1);
  offset = ::vk::Allocation::getOffset(&local_98);
  ::vk::flushMappedMemoryRange(vkd,device,local_58,offset,0xffffffffffffffff);
  ::vk::Allocation::~Allocation(&local_98);
  ::vk::Allocation::~Allocation(&local_78);
  return;
}

Assistant:

void DrawTest::setIndirectCommand (const T (&pCmdData)[N])
{
	DE_ASSERT(N != 0 && N <= MAX_INDIRECT_DRAW_COUNT);

	const std::size_t dataSize = N * sizeof(T);

	deMemcpy(m_indirectBuffer->getBoundMemory().getHostPtr(), pCmdData, dataSize);
	vk::flushMappedMemoryRange(m_vk, m_context.getDevice(), m_indirectBuffer->getBoundMemory().getMemory(), m_indirectBuffer->getBoundMemory().getOffset(), VK_WHOLE_SIZE);
}